

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QMakeEvaluator::Location>::emplace<QMakeEvaluator::Location_const&>
          (QPodArrayOps<QMakeEvaluator::Location> *this,qsizetype i,Location *args)

{
  long lVar1;
  ProFile *pPVar2;
  undefined8 uVar3;
  bool bVar4;
  qsizetype qVar5;
  Location *pLVar6;
  undefined8 *in_RDX;
  long in_RSI;
  QArrayDataPointer<QMakeEvaluator::Location> *in_RDI;
  long in_FS_OFFSET;
  Location *where;
  GrowthPosition pos;
  bool detach;
  Location tmp;
  QArrayDataPointer<QMakeEvaluator::Location> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 uVar8;
  QArrayDataPointer<QMakeEvaluator::Location> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar4 = QArrayDataPointer<QMakeEvaluator::Location>::needsDetach(in_stack_ffffffffffffffc0);
  uVar8 = CONCAT13(bVar4,(int3)in_stack_ffffffffffffffcc);
  if (!bVar4) {
    if ((in_RSI == in_RDI->size) &&
       (qVar5 = QArrayDataPointer<QMakeEvaluator::Location>::freeSpaceAtEnd
                          ((QArrayDataPointer<QMakeEvaluator::Location> *)
                           CONCAT44(uVar8,in_stack_ffffffffffffffc8)), qVar5 != 0)) {
      pLVar6 = QArrayDataPointer<QMakeEvaluator::Location>::end(in_stack_ffffffffffffffc0);
      pLVar6->pro = (ProFile *)*in_RDX;
      *(undefined8 *)&pLVar6->line = in_RDX[1];
      in_RDI->size = in_RDI->size + 1;
      goto LAB_002ec78d;
    }
    if ((in_RSI == 0) &&
       (qVar5 = QArrayDataPointer<QMakeEvaluator::Location>::freeSpaceAtBegin
                          ((QArrayDataPointer<QMakeEvaluator::Location> *)
                           CONCAT44(uVar8,in_stack_ffffffffffffffc8)), qVar5 != 0)) {
      pLVar6 = QArrayDataPointer<QMakeEvaluator::Location>::begin
                         ((QArrayDataPointer<QMakeEvaluator::Location> *)0x2ec6b6);
      pLVar6[-1].pro = (ProFile *)*in_RDX;
      *(undefined8 *)&pLVar6[-1].line = in_RDX[1];
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_002ec78d;
    }
  }
  pPVar2 = (ProFile *)*in_RDX;
  uVar3 = in_RDX[1];
  uVar7 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar7 = 1;
  }
  QArrayDataPointer<QMakeEvaluator::Location>::detachAndGrow
            (this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (Location **)CONCAT44(uVar8,uVar7),in_stack_ffffffffffffffc0);
  pLVar6 = createHole((QPodArrayOps<QMakeEvaluator::Location> *)this_00,
                      (GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
                      CONCAT44(uVar8,uVar7));
  pLVar6->pro = pPVar2;
  *(undefined8 *)&pLVar6->line = uVar3;
LAB_002ec78d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }